

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderTGA.cpp
# Opt level: O1

IImage * __thiscall irr::video::CImageLoaderTGA::loadImage(CImageLoaderTGA *this,IReadFile *file)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  u16 uVar4;
  s32 *palette;
  long lVar5;
  IReadFile *this_00;
  s32 *in;
  IImage *this_01;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar10;
  double __x;
  double __x_00;
  double __x_01;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  STGAHeader header;
  STGAHeader local_42;
  dimension2d<unsigned_int> local_30;
  
  this_00 = file;
  (**file->_vptr_IReadFile)(file,&local_42,0x12);
  if ((local_42.ImageWidth < 0x59d9) && (local_42.ImageHeight < 0x59d9)) {
    if ((ulong)local_42.IdLength != 0) {
      this_00 = file;
      (*file->_vptr_IReadFile[1])(file,(ulong)local_42.IdLength,1);
    }
    uVar4 = local_42.ColorMapLength;
    if (local_42.ColorMapType == '\0') {
      palette = (s32 *)0x0;
    }
    else {
      uVar8 = (ulong)local_42.ColorMapLength;
      uVar7 = 0x100;
      if (0x100 < local_42.ColorMapLength) {
        uVar7 = (uint)local_42.ColorMapLength;
      }
      palette = (s32 *)operator_new__((ulong)(uVar7 * 4));
      auVar3 = _DAT_002323d0;
      auVar2 = _DAT_002323c0;
      auVar1 = _DAT_0022c020;
      if (uVar8 < 0x100) {
        lVar5 = (ulong)(uVar7 - uVar4 & 0xffff) - 1;
        auVar9._8_4_ = (int)lVar5;
        auVar9._0_8_ = lVar5;
        auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
        uVar6 = 0;
        auVar9 = auVar9 ^ _DAT_0022c020;
        do {
          auVar11._8_4_ = (int)uVar6;
          auVar11._0_8_ = uVar6;
          auVar11._12_4_ = (int)(uVar6 >> 0x20);
          auVar12 = (auVar11 | auVar3) ^ auVar1;
          iVar10 = auVar9._4_4_;
          if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ ||
                      iVar10 < auVar12._4_4_) & 1)) {
            palette[uVar8 + uVar6] = -0xff33;
          }
          if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
              auVar12._12_4_ <= auVar9._12_4_) {
            palette[uVar8 + uVar6 + 1] = -0xff33;
          }
          auVar11 = (auVar11 | auVar2) ^ auVar1;
          iVar13 = auVar11._4_4_;
          if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
            palette[uVar8 + uVar6 + 2] = -0xff33;
            palette[uVar8 + uVar6 + 3] = -0xff33;
          }
          uVar6 = uVar6 + 4;
        } while (((uVar7 - uVar4) + 3 & 0x3fc) != uVar6);
      }
      uVar8 = (local_42.ColorMapEntrySize >> 3) * uVar8;
      this_00 = (IReadFile *)operator_new__(uVar8);
      (**file->_vptr_IReadFile)(file,this_00,uVar8);
      if (local_42.ColorMapEntrySize == 0x20) {
        CColorConverter::convert_B8G8R8A8toA8R8G8B8(this_00,(uint)local_42.ColorMapLength,palette);
      }
      else if (local_42.ColorMapEntrySize == 0x18) {
        CColorConverter::convert_B8G8R8toA8R8G8B8(this_00,(uint)local_42.ColorMapLength,palette);
      }
      else if (local_42.ColorMapEntrySize == 0x10) {
        CColorConverter::convert_A1R5G5B5toA8R8G8B8(this_00,(uint)local_42.ColorMapLength,palette);
      }
      operator_delete__(this_00);
    }
    if ((byte)(local_42.ImageType - 1) < 3) {
      uVar8 = (ulong)((uint)(local_42.PixelDepth >> 3) *
                     (local_42._12_4_ & 0xffff) * ((uint)local_42._12_4_ >> 0x10));
      in = (s32 *)operator_new__(uVar8);
      (**file->_vptr_IReadFile)(file,in,uVar8);
    }
    else {
      if (local_42.ImageType != '\n') {
        (*file->_vptr_IReadFile[4])(file);
        os::Printer::log(__x_00);
        if (palette != (s32 *)0x0) {
          operator_delete__(palette);
        }
        goto LAB_0020350a;
      }
      in = (s32 *)loadCompressedImage((CImageLoaderTGA *)this_00,file,&local_42);
    }
    switch((uint)local_42.PixelDepth << 0x1d | local_42.PixelDepth - 8 >> 3) {
    case 0:
      if (local_42.ImageType == '\x03') {
        this_01 = (IImage *)operator_new(0x50);
        local_30.Height._2_2_ = 0;
        local_30._0_6_ = CONCAT24(local_42.ImageHeight,local_42._12_4_) & 0xffff0000ffff;
        CImage::CImage((CImage *)this_01,ECF_R8G8B8,&local_30);
        CColorConverter::convert8BitTo24Bit
                  ((u8 *)in,this_01->Data,local_42._12_4_ & 0xffff,(uint)local_42._12_4_ >> 0x10,
                   (u8 *)0x0,0,(local_42.ImageDescriptor & 0x20) == 0);
      }
      else {
        this_01 = (IImage *)operator_new(0x50);
        if (local_42.ColorMapEntrySize == 0x10) {
          local_30.Height._2_2_ = 0;
          local_30._0_6_ = CONCAT24(local_42.ImageHeight,local_42._12_4_) & 0xffff0000ffff;
          CImage::CImage((CImage *)this_01,ECF_A1R5G5B5,&local_30);
          CColorConverter::convert8BitTo16Bit
                    ((u8 *)in,(s16 *)this_01->Data,local_42._12_4_ & 0xffff,
                     (uint)local_42._12_4_ >> 0x10,palette,0,(local_42.ImageDescriptor & 0x20) == 0)
          ;
        }
        else {
          local_30.Height._2_2_ = 0;
          local_30._0_6_ = CONCAT24(local_42.ImageHeight,local_42._12_4_) & 0xffff0000ffff;
          CImage::CImage((CImage *)this_01,ECF_A8R8G8B8,&local_30);
          CColorConverter::convert8BitTo32Bit
                    ((u8 *)in,this_01->Data,local_42._12_4_ & 0xffff,(uint)local_42._12_4_ >> 0x10,
                     (u8 *)palette,0,(local_42.ImageDescriptor & 0x20) == 0);
        }
      }
      break;
    case 1:
      this_01 = (IImage *)operator_new(0x50);
      local_30.Height._2_2_ = 0;
      local_30._0_6_ = CONCAT24(local_42.ImageHeight,local_42._12_4_) & 0xffff0000ffff;
      CImage::CImage((CImage *)this_01,ECF_A1R5G5B5,&local_30);
      CColorConverter::convert16BitTo16Bit
                ((s16 *)in,(s16 *)this_01->Data,local_42._12_4_ & 0xffff,
                 (uint)local_42._12_4_ >> 0x10,0,(local_42.ImageDescriptor & 0x20) == 0);
      break;
    case 2:
      this_01 = (IImage *)operator_new(0x50);
      local_30.Height._2_2_ = 0;
      local_30._0_6_ = CONCAT24(local_42.ImageHeight,local_42._12_4_) & 0xffff0000ffff;
      CImage::CImage((CImage *)this_01,ECF_R8G8B8,&local_30);
      CColorConverter::convert24BitTo24Bit
                ((u8 *)in,this_01->Data,local_42._12_4_ & 0xffff,(uint)local_42._12_4_ >> 0x10,0,
                 (local_42.ImageDescriptor & 0x20) == 0,true);
      break;
    case 3:
      this_01 = (IImage *)operator_new(0x50);
      local_30.Height._2_2_ = 0;
      local_30._0_6_ = CONCAT24(local_42.ImageHeight,local_42._12_4_) & 0xffff0000ffff;
      CImage::CImage((CImage *)this_01,ECF_A8R8G8B8,&local_30);
      CColorConverter::convert32BitTo32Bit
                (in,(s32 *)this_01->Data,local_42._12_4_ & 0xffff,(uint)local_42._12_4_ >> 0x10,0,
                 (local_42.ImageDescriptor & 0x20) == 0);
      break;
    default:
      (*file->_vptr_IReadFile[4])(file);
      os::Printer::log(__x_01);
      this_01 = (IImage *)0x0;
    }
    if (in != (s32 *)0x0) {
      operator_delete__(in);
    }
    if (palette != (s32 *)0x0) {
      operator_delete__(palette);
    }
  }
  else {
    (*file->_vptr_IReadFile[4])(file);
    os::Printer::log(__x);
LAB_0020350a:
    this_01 = (IImage *)0x0;
  }
  return this_01;
}

Assistant:

IImage *CImageLoaderTGA::loadImage(io::IReadFile *file) const
{
	STGAHeader header;
	u32 *palette = 0;

	file->read(&header, sizeof(STGAHeader));

#ifdef __BIG_ENDIAN__
	header.ColorMapLength = os::Byteswap::byteswap(header.ColorMapLength);
	header.ImageWidth = os::Byteswap::byteswap(header.ImageWidth);
	header.ImageHeight = os::Byteswap::byteswap(header.ImageHeight);
#endif

	if (!checkImageDimensions(header.ImageWidth, header.ImageHeight)) {
		os::Printer::log("Image dimensions too large in file", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// skip image identification field
	if (header.IdLength)
		file->seek(header.IdLength, true);

	if (header.ColorMapType) {
		// Create 32 bit palette
		// `core::max_()` is not used here because it takes its inputs as references. Since `header` is packed, use the macro `MAX()` instead:
		const irr::u16 paletteSize = MAX((u16)256u, header.ColorMapLength); // ColorMapLength can lie, but so far we only use palette for 8-bit, so ensure it has 256 entries
		palette = new u32[paletteSize];

		if (paletteSize > header.ColorMapLength) {
			// To catch images using palette colors with invalid indices
			const irr::u32 errorCol = irr::video::SColor(255, 255, 0, 205).color; // bright magenta
			for (irr::u16 i = header.ColorMapLength; i < paletteSize; ++i)
				palette[i] = errorCol;
		}

		// read color map
		u8 *colorMap = new u8[header.ColorMapEntrySize / 8 * header.ColorMapLength];
		file->read(colorMap, header.ColorMapEntrySize / 8 * header.ColorMapLength);

		// convert to 32-bit palette
		switch (header.ColorMapEntrySize) {
		case 16:
			CColorConverter::convert_A1R5G5B5toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		case 24:
			CColorConverter::convert_B8G8R8toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		case 32:
			CColorConverter::convert_B8G8R8A8toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		}
		delete[] colorMap;
	}

	// read image

	u8 *data = 0;

	if (header.ImageType == 1 ||     // Uncompressed, color-mapped images.
			header.ImageType == 2 || // Uncompressed, RGB images
			header.ImageType == 3    // Uncompressed, black and white images
	) {
		const s32 imageSize = header.ImageHeight * header.ImageWidth * (header.PixelDepth / 8);
		data = new u8[imageSize];
		file->read(data, imageSize);
	} else if (header.ImageType == 10) {
		// Runlength encoded RGB images
		data = loadCompressedImage(file, header);
	} else {
		os::Printer::log("Unsupported TGA file type", file->getFileName(), ELL_ERROR);
		delete[] palette;
		return 0;
	}

	IImage *image = 0;

	switch (header.PixelDepth) {
	case 8: {
		if (header.ImageType == 3) { // grey image
			image = new CImage(ECF_R8G8B8,
					core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
			if (image)
				CColorConverter::convert8BitTo24Bit((u8 *)data,
						(u8 *)image->getData(),
						header.ImageWidth, header.ImageHeight,
						0, 0, (header.ImageDescriptor & 0x20) == 0);
		} else {
			switch (header.ColorMapEntrySize) {
			case 16:
				image = new CImage(ECF_A1R5G5B5, core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
				if (image)
					CColorConverter::convert8BitTo16Bit((u8 *)data,
							(s16 *)image->getData(),
							header.ImageWidth, header.ImageHeight,
							(s32 *)palette, 0,
							(header.ImageDescriptor & 0x20) == 0);
				break;
			// Note: 24 bit with palette would need a 24 bit palette, too lazy doing that now (textures will prefer 32-bit later anyway)
			default:
				image = new CImage(ECF_A8R8G8B8, core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
				if (image)
					CColorConverter::convert8BitTo32Bit((u8 *)data,
							(u8 *)image->getData(),
							header.ImageWidth, header.ImageHeight,
							(u8 *)palette, 0,
							(header.ImageDescriptor & 0x20) == 0);
				break;
			}
		}
	} break;
	case 16:
		image = new CImage(ECF_A1R5G5B5,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert16BitTo16Bit((s16 *)data,
					(s16 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0);
		break;
	case 24:
		image = new CImage(ECF_R8G8B8,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert24BitTo24Bit(
					(u8 *)data, (u8 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0, true);
		break;
	case 32:
		image = new CImage(ECF_A8R8G8B8,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert32BitTo32Bit((s32 *)data,
					(s32 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0);
		break;
	default:
		os::Printer::log("Unsupported TGA format", file->getFileName(), ELL_ERROR);
		break;
	}

	delete[] data;
	delete[] palette;

	return image;
}